

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O3

bool google::protobuf::internal::ReflectionOps::IsInitialized(Message *message)

{
  FieldDescriptor *this;
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  Reflection *this_00;
  Descriptor *pDVar6;
  MapFieldBase *this_01;
  Message *pMVar7;
  long lVar8;
  ulong uVar9;
  int index;
  long lVar10;
  MapIterator iter;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  MapIterator end;
  MapIterator local_a8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_78;
  MapIterator local_60;
  long lVar5;
  
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x15])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  this_00 = GetReflectionOrDie(message);
  iVar2 = *(int *)(lVar5 + 0x68);
  if (0 < iVar2) {
    lVar8 = 0;
    lVar10 = 0;
    do {
      if (*(int *)(*(long *)(lVar5 + 0x28) + 0x3c + lVar8) == 2) {
        bVar1 = Reflection::HasField
                          (this_00,message,(FieldDescriptor *)(*(long *)(lVar5 + 0x28) + lVar8));
        if (!bVar1) {
          return false;
        }
        iVar2 = *(int *)(lVar5 + 0x68);
      }
      lVar10 = lVar10 + 1;
      lVar8 = lVar8 + 0x98;
    } while (lVar10 < iVar2);
  }
  local_78.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::ListFields(this_00,message,&local_78);
  if (local_78.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_78.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar1 = true;
  }
  else {
    uVar9 = 0;
    do {
      this = local_78.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar9];
      if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
        local_a8.iter_ = FieldDescriptor::TypeOnceInit;
        local_60.iter_ = this;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)&local_a8,
                   (FieldDescriptor **)&local_60);
      }
      uVar3 = *(uint *)(this + 0x38);
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)uVar3 * 4) == 10) {
        if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
          local_a8.iter_ = FieldDescriptor::TypeOnceInit;
          local_60.iter_ = this;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)&local_a8,
                     (FieldDescriptor **)&local_60);
          uVar3 = *(uint *)(this + 0x38);
        }
        if ((uVar3 == 0xb) && (bVar1 = FieldDescriptor::is_map_message_type(this), bVar1)) {
          pDVar6 = FieldDescriptor::message_type(this);
          lVar5 = *(long *)(pDVar6 + 0x28);
          if (*(once_flag **)(lVar5 + 200) != (once_flag *)0x0) {
            local_60.iter_ = (void *)(lVar5 + 0x98);
            local_a8.iter_ = FieldDescriptor::TypeOnceInit;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (*(once_flag **)(lVar5 + 200),(_func_void_FieldDescriptor_ptr **)&local_a8,
                       (FieldDescriptor **)&local_60);
          }
          if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar5 + 0xd0) * 4) ==
              10) {
            this_01 = Reflection::GetMapData(this_00,message,this);
            bVar1 = MapFieldBase::IsMapValid(this_01);
            if (!bVar1) goto LAB_0029efe5;
            MapIterator::MapIterator(&local_a8,message,this);
            MapIterator::MapIterator(&local_60,message,this);
            (*this_01->_vptr_MapFieldBase[6])(this_01,&local_a8);
            (*this_01->_vptr_MapFieldBase[7])(this_01,&local_60);
            while (iVar2 = (*(local_a8.map_)->_vptr_MapFieldBase[5])
                                     (local_a8.map_,&local_a8,&local_60), (char)iVar2 == '\0') {
              pMVar7 = MapValueRef::GetMessageValue(&local_a8.value_);
              iVar2 = (*(pMVar7->super_MessageLite)._vptr_MessageLite[8])(pMVar7);
              if ((char)iVar2 == '\0') {
                MapIterator::~MapIterator(&local_60);
                MapIterator::~MapIterator(&local_a8);
                goto LAB_0029f099;
              }
              (*(local_a8.map_)->_vptr_MapFieldBase[0x12])(local_a8.map_,&local_a8);
            }
            MapIterator::~MapIterator(&local_60);
            MapIterator::~MapIterator(&local_a8);
          }
        }
        else {
LAB_0029efe5:
          if (*(int *)(this + 0x3c) == 3) {
            iVar2 = Reflection::FieldSize(this_00,message,this);
            if (0 < iVar2) {
              index = 0;
              do {
                pMVar7 = Reflection::GetRepeatedMessage(this_00,message,this,index);
                iVar4 = (*(pMVar7->super_MessageLite)._vptr_MessageLite[8])(pMVar7);
                if ((char)iVar4 == '\0') goto LAB_0029f099;
                index = index + 1;
              } while (iVar2 != index);
            }
          }
          else {
            pMVar7 = Reflection::GetMessage(this_00,message,this,(MessageFactory *)0x0);
            iVar2 = (*(pMVar7->super_MessageLite)._vptr_MessageLite[8])(pMVar7);
            if ((char)iVar2 == '\0') {
LAB_0029f099:
              bVar1 = false;
              goto LAB_0029f0a0;
            }
          }
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)local_78.
                                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_78.
                                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
    bVar1 = true;
  }
LAB_0029f0a0:
  if (local_78.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool ReflectionOps::IsInitialized(const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = GetReflectionOrDie(message);

  // Check required fields of this message.
  for (int i = 0; i < descriptor->field_count(); i++) {
    if (descriptor->field(i)->is_required()) {
      if (!reflection->HasField(message, descriptor->field(i))) {
        return false;
      }
    }
  }

  // Check that sub-messages are initialized.
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(message, &fields);
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {

      if (field->is_map()) {
        const FieldDescriptor* value_field = field->message_type()->field(1);
        if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
          const MapFieldBase* map_field =
              reflection->GetMapData(message, field);
          if (map_field->IsMapValid()) {
            MapIterator iter(const_cast<Message*>(&message), field);
            MapIterator end(const_cast<Message*>(&message), field);
            for (map_field->MapBegin(&iter), map_field->MapEnd(&end);
                 iter != end; ++iter) {
              if (!iter.GetValueRef().GetMessageValue().IsInitialized()) {
                return false;
              }
            }
            continue;
          }
        } else {
          continue;
        }
      }

      if (field->is_repeated()) {
        int size = reflection->FieldSize(message, field);

        for (int j = 0; j < size; j++) {
          if (!reflection->GetRepeatedMessage(message, field, j)
                   .IsInitialized()) {
            return false;
          }
        }
      } else {
        if (!reflection->GetMessage(message, field).IsInitialized()) {
          return false;
        }
      }
    }
  }

  return true;
}